

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O3

int mixed_compute_gains(float *position,float *gains,mixed_channel_t *speakers,
                       mixed_channel_t *count,vbap_data *data)

{
  float fVar1;
  mixed_channel_t mVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  mixed_channel_t mVar6;
  int iVar7;
  float *pfVar8;
  mixed_channel_t mVar9;
  float *pfVar10;
  long lVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined8 local_48;
  float local_40;
  mixed_channel_t *local_38;
  float gain [3];
  
  mVar2 = data->dims;
  fVar1 = *position;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(position + 1);
  auVar13 = vmovshdup_avx(auVar18);
  fVar12 = (float)*(ulong *)(position + 1);
  auVar13 = ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_ + fVar1 * fVar1 + fVar12 * fVar12));
  auVar13 = vsqrtss_avx(auVar13,auVar13);
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  fVar17 = auVar13._0_4_;
  fVar12 = 0.0;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  if (0.0 < fVar17) {
    fVar12 = fVar1 / fVar17;
    auVar14._4_4_ = fVar17;
    auVar14._0_4_ = fVar17;
    auVar14._8_4_ = fVar17;
    auVar14._12_4_ = fVar17;
    auVar13 = vdivps_avx(auVar18,auVar14);
    if (((fVar12 != 0.0) || (auVar13._0_4_ != 0.0)) || (NAN(auVar13._0_4_))) goto LAB_00128478;
    auVar22 = vmovshdup_avx(auVar13);
    if ((auVar22._0_4_ != 0.0) || (NAN(auVar22._0_4_))) goto LAB_00128478;
  }
  if (mVar2 == '\x03') {
    auVar15._8_4_ = 0xbf800000;
    auVar15._0_8_ = 0xbf800000bf800000;
    auVar15._12_4_ = 0xbf800000;
    auVar13 = vinsertps_avx(auVar15,auVar22,0x10);
  }
  else {
    auVar13 = vblendps_avx(auVar13,_DAT_002ad2b0,0xe);
  }
LAB_00128478:
  iVar7 = data->set_count;
  local_38 = count;
  if (iVar7 < 1) {
    uVar4 = 0;
  }
  else {
    auVar22 = vmovshdup_avx(auVar13);
    pfVar8 = data->sets[0].inv_mat + 2;
    auVar23 = ZEXT464(0xff800000);
    uVar5 = 0;
    uVar4 = 0;
    mVar6 = mVar2;
    do {
      local_40 = 0.0;
      local_48 = 0;
      auVar18 = SUB6416(ZEXT464(0x7f800000),0);
      mVar9 = mVar2;
      if ('\0' < (char)mVar2) {
        lVar11 = 0;
        pfVar10 = (float *)&local_48;
        do {
          fVar1 = auVar22._0_4_ * pfVar8[lVar11] +
                  fVar12 * pfVar8[lVar11 + -2] + auVar13._0_4_ * pfVar8[lVar11 + -1];
          *pfVar10 = fVar1;
          mVar9 = mVar9 + 0xff + (fVar1 < -0.01);
          auVar18 = vminss_avx(ZEXT416((uint)fVar1),auVar18);
          lVar11 = lVar11 + 3;
          pfVar10 = pfVar10 + 1;
        } while ((ulong)(uint)(int)(char)mVar2 * 3 != lVar11);
      }
      if ((auVar23._0_4_ < auVar18._0_4_) && ((char)mVar9 <= (char)mVar6)) {
        gains[2] = local_40;
        *(undefined8 *)gains = local_48;
        iVar7 = data->set_count;
        auVar23 = ZEXT1664(auVar18);
        uVar4 = uVar5 & 0xffffffff;
        mVar6 = mVar9;
      }
      uVar5 = uVar5 + 1;
      pfVar8 = pfVar8 + 10;
    } while ((long)uVar5 < (long)iVar7);
    uVar4 = uVar4 & 0xff;
  }
  speakers[2] = data->sets[uVar4].speakers[2];
  *(undefined2 *)speakers = *(undefined2 *)data->sets[uVar4].speakers;
  if ((char)mVar2 < '\x01') {
    iVar7 = 1;
  }
  else {
    iVar7 = 1;
    uVar4 = 0;
    do {
      if (gains[uVar4] < -0.01) {
        gains[uVar4] = 0.0001;
        iVar7 = 0;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)(int)(char)mVar2 != uVar4);
  }
  fVar1 = gains[2];
  uVar4 = *(ulong *)gains;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar4;
  fVar12 = (float)uVar4;
  auVar16._0_4_ = fVar12 * fVar12;
  fVar17 = (float)(uVar4 >> 0x20);
  auVar16._4_4_ = fVar17 * fVar17;
  auVar16._8_8_ = 0;
  auVar13 = vmovshdup_avx(auVar16);
  auVar13 = ZEXT416((uint)(fVar1 * fVar1 + fVar12 * fVar12 + auVar13._0_4_));
  auVar13 = vsqrtss_avx(auVar13,auVar13);
  fVar12 = 0.0;
  fVar17 = auVar13._0_4_;
  bVar3 = 0.0 < fVar17;
  auVar20._4_4_ = fVar17;
  auVar20._0_4_ = fVar17;
  auVar20._8_4_ = fVar17;
  auVar20._12_4_ = fVar17;
  auVar13 = vdivps_avx(auVar19,auVar20);
  auVar21[1] = bVar3;
  auVar21[0] = bVar3;
  auVar21[2] = bVar3;
  auVar21[3] = bVar3;
  auVar21[4] = bVar3;
  auVar21[5] = bVar3;
  auVar21[6] = bVar3;
  auVar21[7] = bVar3;
  auVar21[8] = bVar3;
  auVar21[9] = bVar3;
  auVar21[10] = bVar3;
  auVar21[0xb] = bVar3;
  auVar21[0xc] = bVar3;
  auVar21[0xd] = bVar3;
  auVar21[0xe] = bVar3;
  auVar21[0xf] = bVar3;
  auVar22 = vpslld_avx(auVar21,0x1f);
  auVar22 = vpsrad_avx(auVar22,0x1f);
  auVar13 = vpand_avx(auVar22,auVar13);
  if (0.0 < fVar17) {
    fVar12 = fVar1 / fVar17;
  }
  *(long *)gains = auVar13._0_8_;
  gains[2] = fVar12;
  *local_38 = mVar2;
  return iVar7;
}

Assistant:

VECTORIZE int mixed_compute_gains(const float position[3], float gains[], mixed_channel_t speakers[], mixed_channel_t *count, struct vbap_data *data){
  char dims = data->dims;
  float best_gain = -INFINITY;
  char best_negs = dims;
  mixed_channel_t best_set = 0;
  
  // If the direction is a zero vector, recast as 0,-1,0 on 3d, and 0,0,1 on 2d.
  // which should give a best approximation for being "on" the position.
  // Ideally we'd drive *all* speakers in that case, but the exact power of them
  // isn't clear to me.
  float direction[3];
  vec_normalize(direction, position);
  if(direction[0] == 0.0 && direction[1] == 0.0 && direction[2] == 0.0){
    if(dims == 3) direction[1] = -1.0;
    else          direction[2] = +1.0;
  }
  // Find set with the highest correspondence to our direction
  for(int i=0; i<data->set_count; ++i){
    float gain[3] = {0.0, 0.0, 0.0};
    float cur_gain = INFINITY;
    char cur_negs = dims;
    
    for(int j=0; j<dims; ++j){
      gain[j] = direction[0] * data->sets[i].inv_mat[0+j*3] +
                direction[1] * data->sets[i].inv_mat[1+j*3] +
                direction[2] * data->sets[i].inv_mat[2+j*3];
      if(gain[j] < cur_gain)
        cur_gain = gain[j];
      if(-0.01 <= gain[j])
        cur_negs--;
    }
    if(best_gain < cur_gain && cur_negs <= best_negs){
      best_gain = cur_gain;
      best_negs = cur_negs;
      best_set = i;
      memcpy(gains, gain, sizeof(float)*3);
    }
  }
  memcpy(speakers, data->sets[best_set].speakers, sizeof(mixed_channel_t)*3);
  // Handle if the best set still does not contain our point.
  char okey = 1;
  for(int i=0; i<dims; ++i){
    if(gains[i] < -0.01){
      gains[i] = 0.0001;
      okey = 0;
    }
  }
  vec_normalize(gains, gains);
  *count = dims;
  return okey;
}